

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::StatementP::StatementP(StatementP *this,Statement *ptr)

{
  SharedPtrStateBase *pSVar1;
  
  (this->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).m_state =
       (SharedPtrStateBase *)0x0;
  (this->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).m_ptr = ptr;
  pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar1->strongRefCount = 0;
  pSVar1->weakRefCount = 0;
  pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02167d08;
  pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)ptr;
  (this->super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).m_state = pSVar1;
  pSVar1->strongRefCount = 1;
  pSVar1->weakRefCount = 1;
  return;
}

Assistant:

explicit	StatementP			(const Statement* ptr)	: Super(ptr) {}